

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [4] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p;
  short ktm [4] [3];
  Mat *m;
  Allocator *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  int iVar2;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar3;
  short local_188 [12];
  char *local_170;
  char *local_168;
  char *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined4 local_140;
  long local_138;
  int local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  long local_118;
  long local_110;
  char *local_108;
  int local_100;
  int local_fc;
  short local_f8 [20];
  int local_d0;
  int local_cc;
  long *local_c8;
  long *local_c0;
  undefined8 *local_b8;
  undefined8 *local_a8;
  undefined1 local_9d;
  int local_9c;
  long *local_98;
  undefined8 *local_90;
  long local_60;
  undefined4 local_54;
  long local_50;
  long local_48;
  undefined4 local_3c;
  int local_38;
  int local_34;
  undefined8 *local_30;
  undefined4 local_24;
  long local_20;
  long *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_d0 = in_ECX;
  local_cc = in_EDX;
  local_c8 = in_RSI;
  local_c0 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
              (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
              in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_f8[0] = 2;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 1;
  local_f8[4] = 1;
  local_f8[5] = 1;
  local_f8[6] = 1;
  local_f8[7] = -1;
  local_f8[8] = 1;
  local_f8[9] = 0;
  local_f8[10] = 0;
  local_f8[0xb] = 2;
  for (local_fc = 0; local_fc < local_d0; local_fc = local_fc + 1) {
    for (local_100 = 0; local_100 < local_cc; local_100 = local_100 + 1) {
      local_18 = local_c0;
      local_108 = (char *)(*local_c0 + (long)(local_fc * local_cc * 9) + (long)(local_100 * 9));
      local_90 = &local_158;
      local_98 = local_c8;
      local_9c = local_fc;
      local_34 = *(int *)((long)local_c8 + 0x2c);
      local_48 = *local_c8 + local_c8[8] * (long)local_fc * local_c8[2];
      local_50 = local_c8[2];
      local_30 = &local_158;
      local_38 = (int)local_c8[6];
      local_3c = *(undefined4 *)((long)local_c8 + 0x34);
      local_54 = (int)local_c8[3];
      local_60 = local_c8[4];
      local_138 = local_c8[4];
      local_20 = (long)local_34 * (long)(int)local_c8[6] * local_50;
      local_24 = 0x10;
      local_130 = (int)local_c8[5] + -1;
      if ((int)local_c8[5] == 4) {
        local_118 = (long)*(int *)((long)local_c8 + 0x2c) * (long)(int)local_c8[6];
      }
      local_9d = 1;
      local_8 = &local_158;
      local_c = local_100;
      local_b8 = &local_158;
      local_a8 = &local_158;
      local_158 = 0;
      local_148 = 0;
      local_140 = 0;
      local_12c = 0;
      local_128 = 0;
      local_124 = 0;
      local_120 = 0;
      local_150 = 0;
      local_110 = local_48 + (long)local_34 * (long)local_100 * local_50;
      local_160 = local_108;
      local_168 = local_108 + 3;
      local_170 = local_108 + 6;
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        local_188[(long)iVar3 * 3] =
             (short)*local_160 * local_f8[(long)iVar3 * 3] +
             (short)local_160[1] * local_f8[(long)iVar3 * 3 + 1] +
             (short)local_160[2] * local_f8[(long)iVar3 * 3 + 2];
        local_188[(long)iVar3 * 3 + 1] =
             (short)*local_168 * local_f8[(long)iVar3 * 3] +
             (short)local_168[1] * local_f8[(long)iVar3 * 3 + 1] +
             (short)local_168[2] * local_f8[(long)iVar3 * 3 + 2];
        local_188[(long)iVar3 * 3 + 2] =
             (short)*local_170 * local_f8[(long)iVar3 * 3] +
             (short)local_170[1] * local_f8[(long)iVar3 * 3 + 1] +
             (short)local_170[2] * local_f8[(long)iVar3 * 3 + 2];
      }
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        lVar1 = (long)iVar3;
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          *(short *)(local_110 + (long)(iVar3 * 4 + iVar2) * 2) =
               local_188[lVar1 * 3] * local_f8[(long)iVar2 * 3] +
               local_188[lVar1 * 3 + 1] * local_f8[(long)iVar2 * 3 + 1] +
               local_188[lVar1 * 3 + 2] * local_f8[(long)iVar2 * 3 + 2];
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch, (size_t)2u);

    // G
    const short ktm[4][3] = {
        {2, 0, 0},
        {1, 1, 1},
        {1, -1, 1},
        {0, 0, 2}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}